

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.h
# Opt level: O0

void __thiscall QLineEditPrivate::~QLineEditPrivate(QLineEditPrivate *this)

{
  QWidgetPrivate *in_RDI;
  vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
  *unaff_retaddr;
  
  *(undefined ***)in_RDI = &PTR__QLineEditPrivate_00d15388;
  std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
  ::~vector(unaff_retaddr);
  std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
  ::~vector(unaff_retaddr);
  QString::~QString((QString *)0x5cdc93);
  QBasicTimer::~QBasicTimer((QBasicTimer *)in_RDI);
  QBasicTimer::~QBasicTimer((QBasicTimer *)in_RDI);
  QPointer<QAction>::~QPointer((QPointer<QAction> *)0x5cdcc6);
  QWidgetPrivate::~QWidgetPrivate(in_RDI);
  return;
}

Assistant:

~QLineEditPrivate()
    {
    }